

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::utf8_4bytes(spec *param_1)

{
  sequence *in_RDI;
  undefined4 in_stack_fffffffffffffe8c;
  undefined2 uVar1;
  character_in_range *in_stack_fffffffffffffe90;
  either *this;
  character_in_range *in_stack_fffffffffffffea0;
  character_in_range *args_1;
  character_in_range *in_stack_fffffffffffffea8;
  sequence *args_2;
  sequence *in_stack_fffffffffffffeb0;
  sequence *this_00;
  sequence *args;
  sequence *this_01;
  undefined1 local_110 [32];
  character_in_range local_f0 [3];
  undefined1 local_c0 [192];
  
  uVar1 = (undefined2)((uint)in_stack_fffffffffffffe8c >> 0x10);
  this_01 = in_RDI;
  character::character
            ((character *)in_stack_fffffffffffffe90,
             (char_type)((uint)in_stack_fffffffffffffe8c >> 0x18));
  character_in_range::character_in_range
            (in_stack_fffffffffffffe90,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (in_stack_fffffffffffffeb0,(character *)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffea0);
  this_00 = (sequence *)(local_c0 + 0x10);
  character_in_range::character_in_range
            (in_stack_fffffffffffffe90,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  args = (sequence *)local_c0;
  character_in_range::character_in_range
            (in_stack_fffffffffffffe90,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (this_00,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  args_1 = local_f0;
  character::character((character *)in_stack_fffffffffffffe90,(char_type)((ushort)uVar1 >> 8));
  args_2 = (sequence *)(local_110 + 0x10);
  character_in_range::character_in_range
            (in_stack_fffffffffffffe90,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (this_00,(character *)args_2,args_1);
  either::either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            ((either *)this_01,args,this_00,args_2);
  this = (either *)local_110;
  uVar1 = 0;
  character_in_range::character_in_range((character_in_range *)this,'\0','\0');
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::
  sequence<toml::detail::either,toml::detail::character_in_range,toml::detail::character_in_range>
            (this_01,(either *)args,(character_in_range *)this_00,(character_in_range *)args_2);
  character_in_range::~character_in_range((character_in_range *)0x72abff);
  character_in_range::~character_in_range((character_in_range *)0x72ac09);
  either::~either(this);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x72ac2d);
  character::~character((character *)0x72ac3a);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x72ac54);
  character_in_range::~character_in_range((character_in_range *)0x72ac61);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x72ac7b);
  character::~character((character *)0x72ac88);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence utf8_4bytes(const spec&)
{
    return sequence(/*1~2 bytes = */either(
        sequence(character         (0xF0),       character_in_range(0x90, 0xBF)),
        sequence(character_in_range(0xF1, 0xF3), character_in_range(0x80, 0xBF)),
        sequence(character         (0xF4),       character_in_range(0x80, 0x8F))
    ), character_in_range(0x80, 0xBF), character_in_range(0x80, 0xBF));
}